

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

void __thiscall
QTextStreamPrivate::putString(QTextStreamPrivate *this,QLatin1StringView data,bool number)

{
  char16_t cVar1;
  undefined3 in_register_00000009;
  undefined4 uVar2;
  undefined4 in_register_0000000c;
  char16_t cVar3;
  byte *__buf;
  long len;
  long in_FS_OFFSET;
  PaddingResult PVar4;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  char16_t local_3a;
  long local_38;
  
  uVar2 = CONCAT31(in_register_00000009,number);
  __buf = (byte *)data.m_data;
  len = data.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->params).fieldWidth <= len) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      write(this,(int)data.m_size,__buf,CONCAT44(in_register_0000000c,uVar2));
      return;
    }
    goto LAB_002cbbf4;
  }
  PVar4 = padding(this,len);
  if (number && (this->params).fieldAlignment == AlignAccountingStyle) {
    if (len < 1) {
      cVar3 = L'\0';
    }
    else {
      cVar3 = (char16_t)*__buf;
    }
    local_3a = cVar3;
    QLocale::negativeSign((QString *)&local_58,&this->locale);
    if ((local_58.size == 1) && (*local_58.ptr == cVar3)) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_002cbb55:
      write(this,(int)&local_3a,(void *)0x1,CONCAT44(in_register_0000000c,uVar2));
      __buf = __buf + 1;
      len = len + -1;
    }
    else {
      QLocale::positiveSign((QString *)&local_70,&this->locale);
      if (local_70.size == 1) {
        cVar1 = *local_70.ptr;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        if (cVar1 == cVar3) goto LAB_002cbb55;
      }
      else {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
    }
  }
  writePadding(this,PVar4.left);
  write(this,(int)len,__buf,CONCAT44(in_register_0000000c,uVar2));
  writePadding(this,PVar4.right);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002cbbf4:
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::putString(QLatin1StringView data, bool number)
{
    if (Q_UNLIKELY(params.fieldWidth > data.size())) {

        // handle padding

        const PaddingResult pad = padding(data.size());

        if (params.fieldAlignment == QTextStream::AlignAccountingStyle && number) {
            const QChar sign = data.size() > 0 ? QLatin1Char(*data.data()) : QChar();
            if (sign == locale.negativeSign() || sign == locale.positiveSign()) {
                // write the sign before the padding, then skip it later
                write(&sign, 1);
                data = QLatin1StringView(data.data() + 1, data.size() - 1);
            }
        }

        writePadding(pad.left);
        write(data);
        writePadding(pad.right);
    } else {
        write(data);
    }
}